

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O0

bool __thiscall XmlRpc::XmlRpcValue::arrayFromXml(XmlRpcValue *this,string *valueXml,int *offset)

{
  bool bVar1;
  tm *ptVar2;
  value_type *in_RDI;
  int *in_stack_00000018;
  string *in_stack_00000020;
  XmlRpcValue v;
  string *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  XmlRpcValue local_30 [2];
  byte local_1;
  
  bVar1 = XmlRpcUtil::nextTagIs(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,(int *)in_RDI);
  if (bVar1) {
    in_RDI->_type = TypeArray;
    ptVar2 = (tm *)operator_new(0x18);
    std::vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_>::vector
              ((vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_> *)0x56d293);
    (in_RDI->_value).asTime = ptVar2;
    XmlRpcValue(local_30);
    while( true ) {
      bVar1 = fromXml((XmlRpcValue *)v._0_8_,in_stack_00000020,in_stack_00000018);
      if (!bVar1) break;
      std::vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_>::push_back
                ((vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_> *)
                 in_stack_ffffffffffffffc0,in_RDI);
    }
    XmlRpcUtil::nextTagIs(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,(int *)in_RDI);
    local_1 = 1;
    ~XmlRpcValue((XmlRpcValue *)0x56d327);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool XmlRpcValue::arrayFromXml(std::string const& valueXml, int* offset)
  {
    if ( ! XmlRpcUtil::nextTagIs(DATA_TAG, valueXml, offset))
      return false;

    _type = TypeArray;
    _value.asArray = new ValueArray;
    XmlRpcValue v;
    while (v.fromXml(valueXml, offset))
      _value.asArray->push_back(v);       // copy...

    // Skip the trailing </data>
    (void) XmlRpcUtil::nextTagIs(DATA_ETAG, valueXml, offset);
    return true;
  }